

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O0

SUNMemoryHelper SUNMemoryHelper_Clone(SUNMemoryHelper helper)

{
  long *in_RDI;
  SUNMemoryHelper hclone;
  SUNContext sunctx_local_scope_;
  SUNMemoryHelper in_stack_ffffffffffffffd8;
  SUNMemoryHelper local_8;
  
  if (*(long *)(in_RDI[1] + 0x28) == 0) {
    if (*in_RDI == 0) {
      local_8 = SUNMemoryHelper_NewEmpty((SUNContext)in_RDI[2]);
      if (local_8 != (SUNMemoryHelper)0x0) {
        SUNMemoryHelper_CopyOps(local_8,in_stack_ffffffffffffffd8);
      }
    }
    else {
      local_8 = (SUNMemoryHelper)0x0;
    }
  }
  else {
    local_8 = (SUNMemoryHelper)(**(code **)(in_RDI[1] + 0x28))(in_RDI);
  }
  return local_8;
}

Assistant:

SUNMemoryHelper SUNMemoryHelper_Clone(SUNMemoryHelper helper)
{
  SUNFunctionBegin(helper->sunctx);
  if (!helper->ops->clone)
  {
    if (helper->content)
    {
      SUNAssertNull(helper->ops->clone, SUN_ERR_NOT_IMPLEMENTED);
      return (NULL);
    }
    else
    {
      SUNMemoryHelper hclone = SUNMemoryHelper_NewEmpty(helper->sunctx);
      if (hclone) { SUNMemoryHelper_CopyOps(helper, hclone); }
      return (hclone);
    }
  }
  else { return (helper->ops->clone(helper)); }
}